

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void __thiscall TadsHttpRequest::~TadsHttpRequest(TadsHttpRequest *this)

{
  OS_Counter *pOVar1;
  StringRef *pSVar2;
  TadsHttpRequestHeader *this_00;
  
  (this->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpRequest_0034b108;
  pSVar2 = this->resource_name;
  LOCK();
  pOVar1 = &(pSVar2->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pSVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pSVar2 = this->verb;
  LOCK();
  pOVar1 = &(pSVar2->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pSVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  CVmWeakRefable::release_ref((CVmWeakRefable *)this->thread);
  pSVar2 = this->headers;
  LOCK();
  pOVar1 = &(pSVar2->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pSVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  this_00 = this->hdr_list;
  if (this_00 != (TadsHttpRequestHeader *)0x0) {
    TadsHttpRequestHeader::~TadsHttpRequestHeader(this_00);
  }
  operator_delete(this_00,0x18);
  pSVar2 = this->body;
  if (pSVar2 != (StringRef *)0x0) {
    LOCK();
    pOVar1 = &(pSVar2->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pSVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
    }
  }
  TadsMessage::~TadsMessage((TadsMessage *)this);
  return;
}

Assistant:

~TadsHttpRequest()
    {
        /* done with our thread and resource name string references */
        resource_name->release_ref();
        verb->release_ref();
        thread->release_ref();
        headers->release_ref();
        delete hdr_list;
        if (body != 0)
            body->release_ref();
    }